

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

X86CPU * cpu_x86_init_x86_64(uc_struct_conflict *uc)

{
  byte *pbVar1;
  uint *puVar2;
  ulong *puVar3;
  TranslationBlock **ppTVar4;
  _Bool _Var5;
  X86CPUDefinition *pXVar6;
  CPUCaches *pCVar7;
  CPUCacheInfo *pCVar8;
  CPUCacheInfo *pCVar9;
  CPUCacheInfo *pCVar10;
  CPUCacheInfo *pCVar11;
  uint uVar12;
  uint32_t uVar13;
  X86CPU *cpu_00;
  X86CPUModel *pXVar14;
  size_t sVar15;
  uint64_t uVar16;
  uint32_t *puVar17;
  ulong uVar18;
  byte bVar19;
  uint64_t *puVar20;
  uint uVar21;
  ulong uVar22;
  X86CPU *cpu;
  uint uVar23;
  long lVar24;
  char *pcVar25;
  
  cpu_00 = (X86CPU *)calloc(1,0xa7c0);
  if (cpu_00 == (X86CPU *)0x0) {
    return (X86CPU *)0x0;
  }
  if (uc->cpu_model == 0x7fffffff) {
    uc->cpu_model = 0;
  }
  else if (0x25 < (uint)uc->cpu_model) goto LAB_0050d8b6;
  (cpu_00->parent_obj).cc = &(cpu_00->cc).parent_class;
  (cpu_00->parent_obj).uc = (uc_struct_conflict7 *)uc;
  uc->cpu = (CPUState *)cpu_00;
  (cpu_00->env).cpuid_level_func7 = 0xffffffff;
  (cpu_00->env).cpuid_level = 0xffffffff;
  (cpu_00->env).cpuid_xlevel = 0xffffffff;
  (cpu_00->env).cpuid_xlevel2 = 0xffffffff;
  cpu_class_init((uc_struct *)uc,&(cpu_00->cc).parent_class);
  (cpu_00->cc).parent_reset = (_func_void_CPUState_ptr *)(cpu_00->cc).parent_class.reset;
  (cpu_00->cc).parent_class.reset = x86_cpu_reset;
  (cpu_00->cc).parent_class.has_work = x86_cpu_has_work;
  (cpu_00->cc).parent_class.do_interrupt = x86_cpu_do_interrupt_x86_64;
  (cpu_00->cc).parent_class.cpu_exec_interrupt = x86_cpu_exec_interrupt_x86_64;
  (cpu_00->cc).parent_class.set_pc = x86_cpu_set_pc;
  (cpu_00->cc).parent_class.synchronize_from_tb = x86_cpu_synchronize_from_tb;
  (cpu_00->cc).parent_class.get_arch_id = x86_cpu_get_arch_id;
  (cpu_00->cc).parent_class.get_paging_enabled = x86_cpu_get_paging_enabled;
  (cpu_00->cc).parent_class.asidx_from_attrs = x86_asidx_from_attrs;
  (cpu_00->cc).parent_class.get_memory_mapping = x86_cpu_get_memory_mapping_x86_64;
  (cpu_00->cc).parent_class.get_phys_page_attrs_debug = x86_cpu_get_phys_page_attrs_debug_x86_64;
  (cpu_00->cc).parent_class.debug_excp_handler = breakpoint_handler_x86_64;
  (cpu_00->cc).parent_class.cpu_exec_enter = x86_cpu_exec_enter_x86_64;
  (cpu_00->cc).parent_class.cpu_exec_exit = x86_cpu_exec_exit_x86_64;
  (cpu_00->cc).parent_class.tcg_initialize = tcg_x86_init_x86_64;
  (cpu_00->cc).parent_class.tlb_fill_cpu = x86_cpu_tlb_fill_x86_64;
  pXVar14 = (X86CPUModel *)calloc(1,0x20);
  (cpu_00->cc).model = pXVar14;
  if (pXVar14 == (X86CPUModel *)0x0) {
LAB_0050d8b6:
    free(cpu_00);
    return (X86CPU *)0x0;
  }
  pXVar14->version = -2;
  pXVar14->cpudef = builtin_x86_defs + uc->cpu_model;
  cpu_common_initfn((uc_struct *)uc,(CPUState *)cpu_00);
  (cpu_00->env).nr_dies = 1;
  (cpu_00->env).nr_nodes = 1;
  (cpu_00->parent_obj).env_ptr = &cpu_00->env;
  (cpu_00->parent_obj).icount_decr_ptr = &(cpu_00->neg).icount_decr;
  (cpu_00->env).uc = uc;
  pXVar14 = (cpu_00->cc).model;
  if (pXVar14 != (X86CPUModel *)0x0) {
    pXVar6 = pXVar14->cpudef;
    (cpu_00->env).cpuid_min_level = pXVar6->level;
    (cpu_00->env).cpuid_xlevel = pXVar6->xlevel;
    uVar12 = pXVar6->family;
    if (uVar12 < 0x10f) {
      uVar21 = uVar12 * 0x100000 - 0xeff100;
      if ((int)uVar12 < 0x10) {
        uVar21 = uVar12 << 8;
      }
      (cpu_00->env).cpuid_version = uVar21 | (cpu_00->env).cpuid_version & 0xf00ff0ff;
    }
    uVar12 = pXVar6->model;
    if (uVar12 < 0x100) {
      (cpu_00->env).cpuid_version =
           (uVar12 & 0xf0) << 0xc | (uVar12 & 0xf) << 4 | (cpu_00->env).cpuid_version & 0xfff0ff0f;
    }
    if ((uint)pXVar6->stepping < 0x10) {
      (cpu_00->env).cpuid_version = (cpu_00->env).cpuid_version & 0xfffffff0 | pXVar6->stepping;
    }
    pcVar25 = "";
    if (pXVar6->model_id != (char *)0x0) {
      pcVar25 = pXVar6->model_id;
    }
    sVar15 = strlen(pcVar25);
    (cpu_00->env).cpuid_model[0] = 0;
    (cpu_00->env).cpuid_model[1] = 0;
    (cpu_00->env).cpuid_model[2] = 0;
    (cpu_00->env).cpuid_model[3] = 0;
    (cpu_00->env).cpuid_model[4] = 0;
    (cpu_00->env).cpuid_model[5] = 0;
    (cpu_00->env).cpuid_model[6] = 0;
    (cpu_00->env).cpuid_model[7] = 0;
    (cpu_00->env).cpuid_model[8] = 0;
    (cpu_00->env).cpuid_model[9] = 0;
    (cpu_00->env).cpuid_model[10] = 0;
    (cpu_00->env).cpuid_model[0xb] = 0;
    bVar19 = 0;
    lVar24 = 0;
    do {
      uVar12 = 0;
      if (lVar24 < (int)sVar15) {
        uVar12 = (uint)(byte)pcVar25[lVar24];
      }
      puVar2 = (uint *)((long)(cpu_00->env).cpuid_model + (ulong)((uint)lVar24 & 0xfffffffc));
      *puVar2 = *puVar2 | uVar12 << (bVar19 & 0x18);
      lVar24 = lVar24 + 1;
      bVar19 = bVar19 + 8;
    } while (lVar24 != 0x30);
    lVar24 = 0;
    do {
      (cpu_00->env).features[lVar24] = pXVar6->features[lVar24];
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x22);
    cpu_00->legacy_cache = pXVar6->cache_info == (CPUCaches *)0x0;
    pbVar1 = (byte *)((long)(cpu_00->env).features + 0xb);
    *pbVar1 = *pbVar1 | 0x80;
    sVar15 = strlen(pXVar6->vendor);
    if (sVar15 == 0xc) {
      (cpu_00->env).cpuid_vendor1 = 0;
      (cpu_00->env).cpuid_vendor2 = 0;
      (cpu_00->env).cpuid_vendor3 = 0;
      pcVar25 = pXVar6->vendor + 8;
      lVar24 = 0;
      uVar12 = 0;
      uVar21 = 0;
      uVar23 = 0;
      do {
        bVar19 = (byte)lVar24;
        uVar12 = uVar12 | (uint)(byte)pcVar25[-8] << (bVar19 & 0x1f);
        (cpu_00->env).cpuid_vendor1 = uVar12;
        uVar21 = uVar21 | (uint)(byte)pcVar25[-4] << (bVar19 & 0x1f);
        (cpu_00->env).cpuid_vendor2 = uVar21;
        uVar23 = uVar23 | (uint)(byte)*pcVar25 << (bVar19 & 0x1f);
        (cpu_00->env).cpuid_vendor3 = uVar23;
        lVar24 = lVar24 + 8;
        pcVar25 = pcVar25 + 1;
      } while (lVar24 != 0x20);
    }
  }
  if (cpu_00->ucode_rev == 0) {
    if ((((cpu_00->env).cpuid_vendor1 != 0x68747541) || ((cpu_00->env).cpuid_vendor2 != 0x69746e65))
       || (uVar16 = 0x1000065, (cpu_00->env).cpuid_vendor3 != 0x444d4163)) {
      uVar16 = 0x100000000;
    }
    cpu_00->ucode_rev = uVar16;
  }
  puVar17 = &(cpu_00->mwait).ecx;
  *(byte *)puVar17 = (byte)*puVar17 | 3;
  if (cpu_00->apic_id == 0xffffffff) goto LAB_0050dac4;
  if (cpu_00->max_features == true) {
    lVar24 = -0x110;
    puVar20 = &feature_word_info[0].no_autoenable_flags;
    do {
      puVar3 = (ulong *)((long)(cpu_00->env).user_features + lVar24);
      *puVar3 = *puVar3 | ~(*puVar20 | *(ulong *)((long)(cpu_00->env).cpuid_model + lVar24)) &
                          puVar20[-1];
      puVar20 = puVar20 + 0x45;
      lVar24 = lVar24 + 8;
    } while (lVar24 != 0);
  }
  (cpu_00->env).features[0xb] = 0;
  if ((*(byte *)((long)(cpu_00->env).features + 0xb) & 4) != 0) {
    puVar17 = &x86_ext_save_areas[0].bits;
    lVar24 = 0;
    uVar22 = 0;
    do {
      uVar18 = 0;
      if ((*puVar17 & (uint)(cpu_00->env).features[((ExtSaveArea *)(puVar17 + -1))->feature]) != 0)
      {
        uVar18 = 1L << ((byte)lVar24 & 0x3f);
      }
      uVar22 = uVar22 | uVar18;
      lVar24 = lVar24 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar24 != 10);
    (cpu_00->env).features[0x15] = uVar22;
    (cpu_00->env).features[0x16] = uVar22 >> 0x20;
  }
  x86_cpu_adjust_feat_level(cpu_00,FEAT_7_0_EBX);
  if (cpu_00->full_cpuid_auto_level == true) {
    x86_cpu_adjust_feat_level(cpu_00,FEAT_1_EDX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_1_ECX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_6_EAX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_7_0_ECX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_7_1_EAX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_8000_0001_EDX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_8000_0001_ECX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_8000_0007_EDX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_8000_0008_EBX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_C000_0001_EDX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_SVM);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_XSAVE);
    if ((((*(byte *)((long)(cpu_00->env).features + 0x13) & 2) != 0) &&
        (cpu_00->intel_pt_auto_level == true)) && ((cpu_00->env).cpuid_min_level < 0x14)) {
      (cpu_00->env).cpuid_min_level = 0x14;
    }
    if ((1 < (cpu_00->env).nr_dies) && ((cpu_00->env).cpuid_min_level < 0x1f)) {
      (cpu_00->env).cpuid_min_level = 0x1f;
    }
    if ((((cpu_00->env).features[7] & 4) != 0) && ((cpu_00->env).cpuid_min_xlevel < 0x8000000a)) {
      (cpu_00->env).cpuid_min_xlevel = 0x8000000a;
    }
  }
  if ((cpu_00->env).cpuid_level_func7 == 0xffffffff) {
    (cpu_00->env).cpuid_level_func7 = (cpu_00->env).cpuid_min_level_func7;
  }
  if ((cpu_00->env).cpuid_level == 0xffffffff) {
    (cpu_00->env).cpuid_level = (cpu_00->env).cpuid_min_level;
  }
  if ((cpu_00->env).cpuid_xlevel == 0xffffffff) {
    (cpu_00->env).cpuid_xlevel = (cpu_00->env).cpuid_min_xlevel;
  }
  if ((cpu_00->env).cpuid_xlevel2 == 0xffffffff) {
    (cpu_00->env).cpuid_xlevel2 = (cpu_00->env).cpuid_min_xlevel2;
  }
  _Var5 = cpu_00->force_features;
  lVar24 = 0x1406;
  puVar20 = &feature_word_info[0].tcg_features;
  do {
    uVar22 = *puVar20;
    uVar18 = (cpu_00->parent_obj).jmp_env[0].__jmpbuf[lVar24 + -8];
    if (_Var5 == false) {
      (cpu_00->parent_obj).jmp_env[0].__jmpbuf[lVar24 + -8] = uVar18 & uVar22;
    }
    ppTVar4 = (cpu_00->parent_obj).tb_jmp_cache + lVar24 + 0x8a;
    *ppTVar4 = (TranslationBlock *)((ulong)*ppTVar4 | uVar18 & ~uVar22);
    lVar24 = lVar24 + 1;
    puVar20 = puVar20 + 0x45;
  } while (lVar24 != 0x1428);
  if (cpu_00->enforce_cpuid == true) {
    if (cpu_00->filtered_features[0] != 0) goto LAB_0050dac4;
    uVar22 = 0;
    do {
      uVar18 = uVar22;
      if (uVar18 == 0x21) {
        uVar18 = 0x21;
        break;
      }
      uVar22 = uVar18 + 1;
    } while (cpu_00->filtered_features[uVar18 + 1] == 0);
    if (uVar18 < 0x21) goto LAB_0050dac4;
  }
  if ((((cpu_00->env).cpuid_vendor1 == 0x68747541) && ((cpu_00->env).cpuid_vendor2 == 0x69746e65))
     && ((cpu_00->env).cpuid_vendor3 == 0x444d4163)) {
    (cpu_00->env).features[6] =
         (ulong)((uint)(cpu_00->env).features[0] & 0x183f3ff |
                (uint)(cpu_00->env).features[6] & 0xfe7c0c00);
  }
  uVar13 = cpu_00->phys_bits;
  if ((*(byte *)((long)(cpu_00->env).features + 0x33) & 0x20) == 0) {
    if (uVar13 != 0) goto LAB_0050dac4;
    uVar13 = (uint)((*(byte *)((long)(cpu_00->env).features + 2) & 2) >> 1) * 4 + 0x20;
LAB_0050d95b:
    cpu_00->phys_bits = uVar13;
  }
  else {
    if (uVar13 == 0) {
      uVar13 = 0x28;
      goto LAB_0050d95b;
    }
    if (uVar13 != 0x28) goto LAB_0050dac4;
  }
  if (cpu_00->legacy_cache == false) {
    pXVar14 = (cpu_00->cc).model;
    if ((pXVar14 == (X86CPUModel *)0x0) ||
       (pCVar7 = pXVar14->cpudef->cache_info, pCVar7 == (CPUCaches *)0x0)) goto LAB_0050dac4;
    pCVar8 = pCVar7->l1d_cache;
    pCVar9 = pCVar7->l1i_cache;
    pCVar10 = pCVar7->l3_cache;
    (cpu_00->env).cache_info_amd.l2_cache = pCVar7->l2_cache;
    (cpu_00->env).cache_info_amd.l3_cache = pCVar10;
    (cpu_00->env).cache_info_amd.l1d_cache = pCVar8;
    (cpu_00->env).cache_info_amd.l1i_cache = pCVar9;
    pCVar8 = pCVar7->l1d_cache;
    pCVar9 = pCVar7->l1i_cache;
    pCVar10 = pCVar7->l2_cache;
    pCVar11 = pCVar7->l3_cache;
    (cpu_00->env).cache_info_cpuid4.l2_cache = pCVar10;
    (cpu_00->env).cache_info_cpuid4.l3_cache = pCVar11;
    (cpu_00->env).cache_info_cpuid4.l1d_cache = pCVar8;
    (cpu_00->env).cache_info_cpuid4.l1i_cache = pCVar9;
    (cpu_00->env).cache_info_cpuid2.l1d_cache = pCVar8;
    (cpu_00->env).cache_info_cpuid2.l1i_cache = pCVar9;
    (cpu_00->env).cache_info_cpuid2.l2_cache = pCVar10;
    (cpu_00->env).cache_info_cpuid2.l3_cache = pCVar11;
  }
  else {
    (cpu_00->env).cache_info_cpuid2.l1d_cache = &legacy_l1d_cache;
    (cpu_00->env).cache_info_cpuid2.l1i_cache = &legacy_l1i_cache;
    (cpu_00->env).cache_info_cpuid2.l2_cache = &legacy_l2_cache_cpuid2;
    (cpu_00->env).cache_info_cpuid2.l3_cache = &legacy_l3_cache;
    (cpu_00->env).cache_info_cpuid4.l1d_cache = &legacy_l1d_cache;
    (cpu_00->env).cache_info_cpuid4.l1i_cache = &legacy_l1i_cache;
    (cpu_00->env).cache_info_cpuid4.l2_cache = &legacy_l2_cache;
    (cpu_00->env).cache_info_cpuid4.l3_cache = &legacy_l3_cache;
    (cpu_00->env).cache_info_amd.l1d_cache = &legacy_l1d_cache_amd;
    (cpu_00->env).cache_info_amd.l1i_cache = &legacy_l1i_cache_amd;
    (cpu_00->env).cache_info_amd.l2_cache = &legacy_l2_cache_amd;
    (cpu_00->env).cache_info_amd.l3_cache = &legacy_l3_cache;
  }
  cpu_exec_realizefn_x86_64((CPUState *)cpu_00);
  if ((0x500 < ((cpu_00->env).cpuid_version & 0xe00)) &&
     ((~(uint)(cpu_00->env).features[0] & 0x4080) == 0)) {
    (cpu_00->env).mcg_cap = (ulong)((uint)cpu_00->enable_lmce << 0x1b) | 0x100010a;
    (cpu_00->env).mcg_ctl = 0xffffffffffffffff;
    lVar24 = 0;
    do {
      *(undefined8 *)((long)(cpu_00->env).mce_banks + lVar24) = 0xffffffffffffffff;
      lVar24 = lVar24 + 0x20;
    } while (lVar24 != 0x140);
  }
  cpu_reset((CPUState *)cpu_00);
LAB_0050dac4:
  cpu_address_space_init_x86_64((CPUState *)cpu_00,0,(cpu_00->parent_obj).memory);
  qemu_init_vcpu_x86_64((CPUState *)cpu_00);
  return cpu_00;
}

Assistant:

X86CPU *cpu_x86_init(struct uc_struct *uc)
{
    X86CPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    X86CPUClass *xcc;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

    if (uc->cpu_model == INT_MAX) {
#ifdef TARGET_X86_64
        uc->cpu_model = UC_CPU_X86_QEMU64; // qemu64
#else
        uc->cpu_model = UC_CPU_X86_QEMU32; // qemu32
#endif
    } else if (uc->cpu_model >= ARRAY_SIZE(builtin_x86_defs)) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;
    cpu->env.cpuid_level_func7 = UINT32_MAX;
    cpu->env.cpuid_level = UINT32_MAX;
    cpu->env.cpuid_xlevel = UINT32_MAX;
    cpu->env.cpuid_xlevel2 = UINT32_MAX;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init X86CPUClass */
    x86_cpu_common_class_init(uc, cc, NULL);

    /* init X86CPUModel */
    /* Ignore X86CPUVersion, X86CPUVersionDefinition.
       we do not need so many cpu types and their property.
       version: more typename. x86_cpu_versioned_model_name().
       alias: more property. */
    xcc = &cpu->cc;
    xcc->model = calloc(1, sizeof(*(xcc->model)));
    if (xcc->model == NULL) {
        free(cpu);
        return NULL;
    }

    xcc->model->version = CPU_VERSION_AUTO;
    xcc->model->cpudef = &builtin_x86_defs[uc->cpu_model];

    if (xcc->model->cpudef == NULL) {
        free(xcc->model);
        free(cpu);
        return NULL;
    }

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init X86CPU */
    x86_cpu_initfn(uc, cs);

    /* realize X86CPU */
    x86_cpu_realizefn(uc, cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    /* realize CPUState */

    return cpu;
}